

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_expression.cpp
# Opt level: O1

FxExpression * __thiscall FxPlusSign::Resolve(FxPlusSign *this,FCompileContext *ctx)

{
  int iVar1;
  undefined4 extraout_var;
  FxExpression *pFVar2;
  
  if ((this->super_FxExpression).isresolved == false) {
    (this->super_FxExpression).isresolved = true;
    if (this->Operand != (FxExpression *)0x0) {
      iVar1 = (*this->Operand->_vptr_FxExpression[2])();
      this->Operand = (FxExpression *)CONCAT44(extraout_var,iVar1);
    }
    pFVar2 = this->Operand;
    if (pFVar2 == (FxExpression *)0x0) {
      pFVar2 = (FxExpression *)0x0;
    }
    else if ((pFVar2->ValueType == (PType *)TypeName) ||
            ((iVar1 = (**(code **)(*(long *)&pFVar2->ValueType->super_DObject + 0x90))(), iVar1 != 0
             && (iVar1 = (*(pFVar2->ValueType->super_DObject)._vptr_DObject[0x12])(), iVar1 != 1))))
    {
      pFVar2 = (FxExpression *)0x0;
      FScriptPosition::Message(&(this->super_FxExpression).ScriptPosition,2,"Numeric type expected")
      ;
    }
    else {
      pFVar2 = this->Operand;
      this->Operand = (FxExpression *)0x0;
    }
    (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
    return pFVar2;
  }
  return &this->super_FxExpression;
}

Assistant:

FxExpression *FxPlusSign::Resolve(FCompileContext& ctx)
{
	CHECKRESOLVED();
	SAFE_RESOLVE(Operand, ctx);

	if (Operand->IsNumeric())
	{
		FxExpression *e = Operand;
		Operand = NULL;
		delete this;
		return e;
	}
	else
	{
		ScriptPosition.Message(MSG_ERROR, "Numeric type expected");
		delete this;
		return NULL;
	}
}